

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

_Bool art_erase(art_t *art,art_key_chunk_t *key,art_val_t *erased_val)

{
  art_erase_result_t result;
  art_erase_result_t local_30;
  
  if (art->root == 0) {
    local_30.erased = false;
  }
  else {
    art_erase_at(&local_30,art,art->root,key,'\0');
    if ((local_30.erased == true) &&
       (art->root = local_30.rootmost_node, erased_val != (art_val_t *)0x0)) {
      *erased_val = local_30.value_erased;
    }
  }
  return local_30.erased;
}

Assistant:

bool art_erase(art_t *art, const art_key_chunk_t *key, art_val_t *erased_val) {
    art_val_t erased_val_local;
    if (erased_val == NULL) {
        erased_val = &erased_val_local;
    }
    if (art->root == CROARING_ART_NULL_REF) {
        return false;
    }
    art_erase_result_t result = art_erase_at(art, art->root, key, 0);
    if (!result.erased) {
        return false;
    }
    art->root = result.rootmost_node;
    *erased_val = result.value_erased;
    return true;
}